

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void __thiscall Exception::Exception(Exception *this,ExceptionsEnum exception,string *msg)

{
  allocator local_21;
  string *local_20;
  string *msg_local;
  Exception *pEStack_10;
  ExceptionsEnum exception_local;
  Exception *this_local;
  
  local_20 = msg;
  msg_local._4_4_ = exception;
  pEStack_10 = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_00165d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->msg,"",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  this->exception = msg_local._4_4_;
  std::__cxx11::string::operator=((string *)&this->msg,(string *)local_20);
  return;
}

Assistant:

Exception::Exception(ExceptionsEnum exception, const string &msg) {
    this->exception = exception;
    this->msg = msg;
}